

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

string * cs_impl::to_string<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>
                   (list *lst)

{
  bool bVar1;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  string *in_RDI;
  var *it;
  const_iterator __end1;
  const_iterator __begin1;
  list *__range1;
  string str;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffff28;
  string *psVar2;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_b0 [8];
  any *in_stack_ffffffffffffff58;
  string local_90 [32];
  reference local_70;
  _Self local_68;
  _Self local_60;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *local_58;
  allocator local_49;
  string local_48 [55];
  allocator local_11;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::empty(in_RSI);
  if (bVar1) {
    paVar3 = &local_11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"list => {}",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    paVar3 = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"list => {",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_58 = local_10;
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
                   (in_stack_ffffffffffffff28);
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                   (in_stack_ffffffffffffff28);
    while( true ) {
      bVar1 = std::operator!=(&local_60,&local_68);
      if (!bVar1) break;
      local_70 = std::_List_const_iterator<cs_impl::any>::operator*
                           ((_List_const_iterator<cs_impl::any> *)paVar3);
      any::to_string_abi_cxx11_(in_stack_ffffffffffffff58);
      std::operator+(in_stack_ffffffffffffff38,(char *)paVar3);
      std::__cxx11::string::operator+=(local_48,local_90);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::_List_const_iterator<cs_impl::any>::operator++(&local_60);
    }
    psVar2 = local_48;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)psVar2);
    std::__cxx11::string::operator+=(local_48,"}");
    std::__cxx11::string::string((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
  }
  return in_RDI;
}

Assistant:

std::string to_string<cs::list>(const cs::list &lst)
	{
		if (lst.empty())
			return "list => {}";
		std::string str = "list => {";
		for (const cs::var &it: lst)
			str += it.to_string() + ", ";
		str.resize(str.size() - 2);
		str += "}";
		return std::move(str);
	}